

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::rehash(hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  long lVar2;
  raw_node *pNode;
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  new_map;
  
  if ((this->m_num_valid <= new_hash_size) && ((this->m_values).m_size != new_hash_size)) {
    new_map.m_values.m_p = (raw_node *)0x0;
    new_map.m_values.m_size = 0;
    new_map.m_values.m_capacity = 0;
    new_map.m_hash_shift = 0x20;
    new_map.m_num_valid = 0;
    new_map.m_grow_threshold = 0;
    vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
    ::resize(&new_map.m_values,new_hash_size,false);
    uVar1 = math::floor_log2i(new_hash_size);
    new_map.m_hash_shift = 0x20 - uVar1;
    new_map.m_grow_threshold = 0xffffffff;
    pNode = (this->m_values).m_p;
    for (lVar2 = (ulong)(this->m_values).m_size << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
      if (pNode->m_bits[9] != '\0') {
        move_into(&new_map,(node *)pNode);
        if (new_map.m_num_valid == this->m_num_valid) break;
      }
      pNode = pNode + 1;
    }
    new_map.m_grow_threshold = new_hash_size + 1 >> 1;
    vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
    ::clear_no_destruction(&this->m_values);
    this->m_hash_shift = 0x20;
    swap(this,&new_map);
    ~hash_map(&new_map);
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }